

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O2

void pbrt::semantic::pbrtInfo(int ac,char **av)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  long lVar5;
  bool bVar6;
  allocator local_219;
  shared_ptr<pbrt::Scene> scene;
  string local_1f0;
  string fileName;
  __shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  runtime_error e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198 [45];
  
  fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
  fileName._M_string_length = 0;
  fileName.field_2._M_local_buf[0] = '\0';
  bVar6 = false;
  for (lVar5 = 1; lVar5 < ac; lVar5 = lVar5 + 1) {
    std::__cxx11::string::string((string *)&e,av[lVar5],(allocator *)&scene);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                            "--lint");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e,"-lint");
      if (!bVar1) {
        if (*_e == '-') {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_1f0,"invalid argument \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scene
                         ,&local_1f0,"\'");
          std::runtime_error::runtime_error(prVar4,(string *)&scene);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::_M_assign((string *)&fileName);
        bVar2 = bVar6;
      }
    }
    bVar6 = bVar2;
    std::__cxx11::string::~string((string *)&e);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"pbrtinfo - printing info on pbrt file ...");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&e,".pbrt",(allocator *)&local_1f0);
  bVar2 = endsWith(&fileName,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (bVar2) {
    std::__cxx11::string::string((string *)&e,"",&local_219);
    importPBRT(&local_1f0,&fileName);
    std::__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> *)&local_1f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f0._M_string_length);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    std::__cxx11::string::string((string *)&e,".pbf",(allocator *)&local_1f0);
    bVar2 = endsWith(&fileName,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (!bVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"un-recognized input file extension");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Scene::loadFrom((Scene *)&e,&fileName);
    std::__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> *)&e);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_198);
  }
  Scene::makeSingleLevel(scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  poVar3 = std::operator<<((ostream *)&std::cout," => yay! parsing successful...");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (!bVar6) {
    std::__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b0,&scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>);
    PBRTInfo::PBRTInfo((PBRTInfo *)&e,(SP *)&local_1b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
    PBRTInfo::~PBRTInfo((PBRTInfo *)&e);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&fileName);
    return;
  }
  exit(0);
}

Assistant:

void pbrtInfo(int ac, char **av)
    {
      std::string fileName;
      bool parseOnly = false;
      for (int i=1;i<ac;i++) {
        const std::string arg = av[i];
        if (arg == "--lint" || arg == "-lint") {
          parseOnly = true;
        } else if (arg[0] == '-') {
          throw std::runtime_error("invalid argument '"+arg+"'");
        } else {
          fileName = arg;
        }          
      }
    
      std::cout << "-------------------------------------------------------" << std::endl;
      std::cout << "pbrtinfo - printing info on pbrt file ..." << std::endl;
      std::cout << "-------------------------------------------------------" << std::endl;
    
      std::shared_ptr<Scene> scene;
      try {
        if (endsWith(fileName,".pbrt"))
          scene = importPBRT(fileName);
        else if (endsWith(fileName,".pbf"))
          scene = Scene::loadFrom(fileName);
        else
          throw std::runtime_error("un-recognized input file extension");

        scene->makeSingleLevel();
        
        std::cout << " => yay! parsing successful..." << std::endl;
        if (parseOnly) exit(0);
        PBRTInfo info(scene);
      } catch (std::runtime_error e) {
        std::cerr << "**** ERROR IN PARSING ****" << std::endl << e.what() << std::endl;
        std::cerr << "(this means that either there's something wrong with that PBRT file, or that the parser can't handle it)" << std::endl;
        exit(1);
      }
    }